

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::Parser::ParseTopLevelStatement
          (Parser *this,FileDescriptorProto *file,LocationRecorder *root_location)

{
  Location *pLVar1;
  bool bVar2;
  int iVar3;
  DescriptorProto *message;
  EnumDescriptorProto *enum_type;
  ServiceDescriptorProto *service;
  RepeatedPtrField<google::protobuf::FieldDescriptorProto> *extensions;
  RepeatedPtrField<google::protobuf::DescriptorProto> *messages;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *dependency;
  RepeatedField<int> *public_dependency;
  RepeatedField<int> *weak_dependency;
  FileOptions *options;
  allocator<char> local_a9;
  string local_a8;
  undefined1 local_88 [8];
  LocationRecorder location_4;
  LocationRecorder location_3;
  LocationRecorder location_2;
  LocationRecorder location_1;
  undefined1 local_38 [8];
  LocationRecorder location;
  LocationRecorder *root_location_local;
  FileDescriptorProto *file_local;
  Parser *this_local;
  
  location.location_ = (Location *)root_location;
  bVar2 = TryConsumeEndOfDeclaration(this,";",(LocationRecorder *)0x0);
  if (bVar2) {
    this_local._7_1_ = true;
  }
  else {
    bVar2 = LookingAt(this,"message");
    pLVar1 = location.location_;
    if (bVar2) {
      iVar3 = FileDescriptorProto::message_type_size(file);
      LocationRecorder::LocationRecorder
                ((LocationRecorder *)local_38,(LocationRecorder *)pLVar1,4,iVar3);
      message = FileDescriptorProto::add_message_type(file);
      this_local._7_1_ = ParseMessageDefinition(this,message,(LocationRecorder *)local_38,file);
      LocationRecorder::~LocationRecorder((LocationRecorder *)local_38);
    }
    else {
      bVar2 = LookingAt(this,"enum");
      pLVar1 = location.location_;
      if (bVar2) {
        iVar3 = FileDescriptorProto::enum_type_size(file);
        LocationRecorder::LocationRecorder
                  ((LocationRecorder *)&location_2.location_,(LocationRecorder *)pLVar1,5,iVar3);
        enum_type = FileDescriptorProto::add_enum_type(file);
        this_local._7_1_ =
             ParseEnumDefinition(this,enum_type,(LocationRecorder *)&location_2.location_,file);
        LocationRecorder::~LocationRecorder((LocationRecorder *)&location_2.location_);
      }
      else {
        bVar2 = LookingAt(this,"service");
        pLVar1 = location.location_;
        if (bVar2) {
          iVar3 = FileDescriptorProto::service_size(file);
          LocationRecorder::LocationRecorder
                    ((LocationRecorder *)&location_3.location_,(LocationRecorder *)pLVar1,6,iVar3);
          service = FileDescriptorProto::add_service(file);
          this_local._7_1_ =
               ParseServiceDefinition(this,service,(LocationRecorder *)&location_3.location_,file);
          LocationRecorder::~LocationRecorder((LocationRecorder *)&location_3.location_);
        }
        else {
          bVar2 = LookingAt(this,"extend");
          if (bVar2) {
            LocationRecorder::LocationRecorder
                      ((LocationRecorder *)&location_4.location_,
                       (LocationRecorder *)location.location_,7);
            extensions = FileDescriptorProto::mutable_extension(file);
            messages = FileDescriptorProto::mutable_message_type(file);
            this_local._7_1_ =
                 ParseExtend(this,extensions,messages,(LocationRecorder *)location.location_,4,
                             (LocationRecorder *)&location_4.location_,file);
            LocationRecorder::~LocationRecorder((LocationRecorder *)&location_4.location_);
          }
          else {
            bVar2 = LookingAt(this,"import");
            if (bVar2) {
              dependency = FileDescriptorProto::mutable_dependency_abi_cxx11_(file);
              public_dependency = FileDescriptorProto::mutable_public_dependency(file);
              weak_dependency = FileDescriptorProto::mutable_weak_dependency(file);
              this_local._7_1_ =
                   ParseImport(this,dependency,public_dependency,weak_dependency,
                               (LocationRecorder *)location.location_,file);
            }
            else {
              bVar2 = LookingAt(this,"package");
              if (bVar2) {
                this_local._7_1_ =
                     ParsePackage(this,file,(LocationRecorder *)location.location_,file);
              }
              else {
                bVar2 = LookingAt(this,"option");
                if (bVar2) {
                  LocationRecorder::LocationRecorder
                            ((LocationRecorder *)local_88,(LocationRecorder *)location.location_,8);
                  options = FileDescriptorProto::mutable_options(file);
                  this_local._7_1_ =
                       ParseOption(this,&options->super_Message,(LocationRecorder *)local_88,file,
                                   OPTION_STATEMENT);
                  LocationRecorder::~LocationRecorder((LocationRecorder *)local_88);
                }
                else {
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_a8,"Expected top-level statement (e.g. \"message\").",
                             &local_a9);
                  AddError(this,&local_a8);
                  std::__cxx11::string::~string((string *)&local_a8);
                  std::allocator<char>::~allocator(&local_a9);
                  this_local._7_1_ = false;
                }
              }
            }
          }
        }
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool Parser::ParseTopLevelStatement(FileDescriptorProto* file,
                                    const LocationRecorder& root_location) {
  if (TryConsumeEndOfDeclaration(";", NULL)) {
    // empty statement; ignore
    return true;
  } else if (LookingAt("message")) {
    LocationRecorder location(root_location,
      FileDescriptorProto::kMessageTypeFieldNumber, file->message_type_size());
    return ParseMessageDefinition(file->add_message_type(), location, file);
  } else if (LookingAt("enum")) {
    LocationRecorder location(root_location,
      FileDescriptorProto::kEnumTypeFieldNumber, file->enum_type_size());
    return ParseEnumDefinition(file->add_enum_type(), location, file);
  } else if (LookingAt("service")) {
    LocationRecorder location(root_location,
      FileDescriptorProto::kServiceFieldNumber, file->service_size());
    return ParseServiceDefinition(file->add_service(), location, file);
  } else if (LookingAt("extend")) {
    LocationRecorder location(root_location,
        FileDescriptorProto::kExtensionFieldNumber);
    return ParseExtend(file->mutable_extension(),
                       file->mutable_message_type(),
                       root_location,
                       FileDescriptorProto::kMessageTypeFieldNumber,
                       location, file);
  } else if (LookingAt("import")) {
    return ParseImport(file->mutable_dependency(),
                       file->mutable_public_dependency(),
                       file->mutable_weak_dependency(),
                       root_location, file);
  } else if (LookingAt("package")) {
    return ParsePackage(file, root_location, file);
  } else if (LookingAt("option")) {
    LocationRecorder location(root_location,
        FileDescriptorProto::kOptionsFieldNumber);
    return ParseOption(file->mutable_options(), location, file,
                       OPTION_STATEMENT);
  } else {
    AddError("Expected top-level statement (e.g. \"message\").");
    return false;
  }
}